

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

bool __thiscall
stream::slice_reader::open_file_case_insensitive
          (slice_reader *this,path_type *dirname,path_type *filename)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  pointer pcVar8;
  size_type sVar9;
  long lVar10;
  ulong unaff_R14;
  ulong uVar11;
  directory_iterator i;
  directory_iterator end;
  path_type actual_filename;
  path p;
  directory_iterator local_b8;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_b0;
  is_iequal local_a8;
  uint local_9c;
  path local_98;
  path_type *local_78;
  locale local_70 [8];
  long *local_68 [2];
  long local_58 [2];
  slice_reader *local_48;
  path_type *local_40;
  size_type local_38;
  
  local_b0.px = (dir_itr_imp *)0x0;
  local_48 = this;
  local_40 = dirname;
  boost::filesystem::directory_iterator::directory_iterator(&local_b8,dirname,none);
  local_78 = filename;
  do {
    if (local_b8.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_b0.px) {
LAB_0014fc3a:
      unaff_R14 = 0;
    }
    else if ((local_b8.m_imp.px == (dir_itr_imp *)0x0) ||
            (unaff_R14 = CONCAT71((int7)(unaff_R14 >> 8),1),
            *(long *)((long)local_b8.m_imp.px + 0x38) == 0)) {
      if (local_b0.px == (dir_itr_imp *)0x0) goto LAB_0014fc3a;
      unaff_R14 = CONCAT71((int7)(unaff_R14 >> 8),*(long *)(local_b0.px + 0x38) != 0);
    }
    if ((char)unaff_R14 == '\0') {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b8.m_imp);
      goto LAB_0014fdd5;
    }
    local_9c = (uint)unaff_R14;
    boost::filesystem::path::filename();
    std::locale::locale(local_70);
    std::locale::locale(&local_a8.m_Loc,local_70);
    sVar5 = local_98.m_pathname._M_string_length;
    _Var4._M_p = local_98.m_pathname._M_dataplus._M_p;
    pcVar3 = (filename->m_pathname)._M_dataplus._M_p;
    sVar9 = (filename->m_pathname)._M_string_length;
    _Var7._M_p = local_98.m_pathname._M_dataplus._M_p;
    pcVar8 = pcVar3;
    if (sVar9 != 0 && local_98.m_pathname._M_string_length != 0) {
      lVar1 = local_98.m_pathname._M_string_length - 1;
      lVar10 = 0;
      local_38 = sVar9;
      do {
        bVar6 = boost::algorithm::is_iequal::operator()
                          (&local_a8,_Var4._M_p + lVar10,pcVar3 + lVar10);
        filename = local_78;
        if (!bVar6) {
          unaff_R14 = 0;
          goto LAB_0014fd18;
        }
        lVar2 = lVar10 + 1;
      } while ((lVar1 != lVar10) && (bVar6 = sVar9 - 1 != lVar10, lVar10 = lVar2, bVar6));
      pcVar8 = pcVar3 + lVar2;
      _Var7._M_p = _Var4._M_p + lVar2;
      sVar9 = local_38;
    }
    uVar11 = (ulong)(pcVar3 + sVar9) ^ (ulong)pcVar8 |
             (ulong)(_Var4._M_p + sVar5) ^ (ulong)_Var7._M_p;
    unaff_R14 = CONCAT71((int7)(uVar11 >> 8),uVar11 == 0);
LAB_0014fd18:
    std::locale::~locale(&local_a8.m_Loc);
    if ((char)unaff_R14 == '\0') {
      bVar6 = false;
    }
    else {
      pcVar8 = (local_40->m_pathname)._M_dataplus._M_p;
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar8,pcVar8 + (local_40->m_pathname)._M_string_length);
      boost::filesystem::path::operator/=((path *)local_68,&local_98);
      bVar6 = open_file(local_48,(path_type *)local_68);
    }
    if (((char)unaff_R14 != '\0') && (local_68[0] != local_58)) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    std::locale::~locale(local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_pathname._M_dataplus._M_p != &local_98.m_pathname.field_2) {
      operator_delete(local_98.m_pathname._M_dataplus._M_p,
                      local_98.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar6 != false) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b8.m_imp);
      unaff_R14 = (ulong)local_9c;
LAB_0014fdd5:
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b0);
      return (bool)(char)unaff_R14;
    }
    boost::filesystem::detail::directory_iterator_increment(&local_b8,(error_code *)0x0);
  } while( true );
}

Assistant:

bool slice_reader::open_file_case_insensitive(const path_type & dirname, const path_type & filename) {
	
	boost::filesystem::directory_iterator end;
	for(boost::filesystem::directory_iterator i(dirname); i != end; ++i) {
		path_type actual_filename = i->path().filename();
		if(boost::iequals(actual_filename.string(), filename.string()) && open_file(dirname / actual_filename)) {
			return true;
		}
	}
	
	return false;
}